

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O2

bool move_prog_stone_roll(ROOM_INDEX_DATA *room,CHAR_DATA *ch,int dir)

{
  ulong uVar1;
  ROOM_INDEX_DATA *pRVar2;
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *obj;
  OBJ_DATA *obj_to;
  string_view fmt;
  
  pRVar2 = get_room_index(0x5fef);
  uVar1 = pRVar2->exit[1]->exit_info[0];
  if ((uVar1 & 2) == 0) {
    pRVar2->exit[1]->exit_info[0] = uVar1 | 0x106;
    act("As you pass through, the stone rolls violently back into place!",ch,(void *)0x0,(void *)0x0
        ,3);
    obj_to = (OBJ_DATA *)&room->contents;
    do {
      obj_to = obj_to->next;
      if (obj_to == (OBJ_DATA *)0x0) {
        fmt._M_str = "Corpse in 24560 missing.  Odd.";
        fmt._M_len = 0x1e;
        CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt);
        return true;
      }
    } while (obj_to->pIndexData->vnum != 0x5fee);
    if (obj_to->contains == (OBJ_DATA *)0x0) {
      pObjIndex = get_obj_index(0x5ff0);
      obj = create_object(pObjIndex,10);
      obj_to_obj(obj,obj_to);
    }
  }
  return true;
}

Assistant:

bool move_prog_stone_roll(ROOM_INDEX_DATA *room, CHAR_DATA *ch, int dir)
{
	ROOM_INDEX_DATA *room2 = get_room_index(24559);
	EXIT_DATA *exit = room2->exit[Directions::East];
	OBJ_DATA *obj, *corpse;
	bool found= false;

	if (IS_SET(exit->exit_info, EX_CLOSED))
		return true;

	SET_BIT(exit->exit_info, EX_CLOSED);
	SET_BIT(exit->exit_info, EX_LOCKED);
	SET_BIT(exit->exit_info, EX_NONOBVIOUS);

	act("As you pass through, the stone rolls violently back into place!", ch, 0, 0, TO_CHAR);

	for (corpse = room->contents; corpse != nullptr; corpse = corpse->next)
	{
		if (corpse->pIndexData->vnum == 24558)
		{
			found = true;
			break;
		}
	}

	if (!found)
	{
		RS.Logger.Warn("Corpse in 24560 missing.  Odd.");
		return true;
	}

	if (corpse->contains)
		return true;

	obj = create_object(get_obj_index(24560), 10);
	obj_to_obj(obj, corpse);
	return true;
}